

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Serialize<VectorWriter,uint256,std::less<uint256>,std::allocator<uint256>>
               (VectorWriter *os,set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *m)

{
  long lVar1;
  bool bVar2;
  VectorWriter *in_RSI;
  VectorWriter *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *in_stack_ffffffffffffffc8;
  VectorWriter *os_00;
  VectorWriter *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::size(in_stack_ffffffffffffffc8);
  WriteCompactSize<VectorWriter>(in_RSI,(uint64_t)this);
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::begin
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)this);
  while( true ) {
    std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::end
              ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)this);
    bVar2 = std::operator==((_Self *)in_RSI,(_Self *)this);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    os_00 = in_RDI;
    std::_Rb_tree_const_iterator<uint256>::operator*((_Rb_tree_const_iterator<uint256> *)in_RDI);
    Serialize<VectorWriter,_uint256>(os_00,(uint256 *)0x702585);
    std::_Rb_tree_const_iterator<uint256>::operator++((_Rb_tree_const_iterator<uint256> *)os_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::set<K, Pred, A>& m)
{
    WriteCompactSize(os, m.size());
    for (typename std::set<K, Pred, A>::const_iterator it = m.begin(); it != m.end(); ++it)
        Serialize(os, (*it));
}